

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O3

void __thiscall GlobOpt::OptNewScObject(GlobOpt *this,Instr **instrPtr,Value *srcVal)

{
  OpCode OVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  JITTimeConstructorCache *this_02;
  undefined4 *puVar5;
  
  if (((((*instrPtr)->m_opcode == NewScObjectNoCtor) || ((*instrPtr)->m_opcode == NewScObject)) &&
      (this->prePassLoop == (Loop *)0x0)) &&
     (bVar4 = DoObjTypeSpec(this,this->currentBlock->loop), bVar4)) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar4 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,ObjTypeSpecNewObjPhase,sourceContextId,functionId);
    if ((!bVar4) && (pIVar2 = *instrPtr, pIVar2->m_kind == InstrKindProfiled)) {
      OVar1 = pIVar2->m_opcode;
      this_02 = Func::GetConstructorCache(pIVar2->m_func,*(ProfileId *)&pIVar2[1]._vptr_Instr);
      if (this_02 != (JITTimeConstructorCache *)0x0) {
        bVar4 = JITTimeConstructorCache::IsTypeFinal(this_02);
        if ((bVar4) &&
           (bVar4 = JITTimeConstructorCache::CtorHasNoExplicitReturnValue(this_02), !bVar4)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                             ,0x669,
                             "(ctorCache == nullptr || !ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue())"
                             ,
                             "ctorCache == nullptr || !ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue()"
                            );
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar5 = 0;
        }
        bVar4 = JITTimeConstructorCache::SkipNewScObject(this_02);
        if (!bVar4) {
          if ((OVar1 != NewScObjectNoCtor) &&
             (bVar4 = JITTimeConstructorCache::IsTypeFinal(this_02), !bVar4)) {
            return;
          }
          GenerateBailAtOperation(this,instrPtr,BailOutFailedCtorGuardCheck);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::OptNewScObject(IR::Instr** instrPtr, Value* srcVal)
{
    IR::Instr *&instr = *instrPtr;

    if (!instr->IsNewScObjectInstr() || IsLoopPrePass() || !this->DoFieldRefOpts() || PHASE_OFF(Js::ObjTypeSpecNewObjPhase, this->func))
    {
        return;
    }

    bool isCtorInlined = instr->m_opcode == Js::OpCode::NewScObjectNoCtor;
    const JITTimeConstructorCache * ctorCache = instr->IsProfiledInstr() ?
        instr->m_func->GetConstructorCache(static_cast<Js::ProfileId>(instr->AsProfiledInstr()->u.profileId)) : nullptr;

    // TODO: OOP JIT, enable assert
    //Assert(ctorCache == nullptr || srcVal->GetValueInfo()->IsVarConstant() && Js::VarIs<Js::JavascriptFunction>(srcVal->GetValueInfo()->AsVarConstant()->VarValue()));
    Assert(ctorCache == nullptr || !ctorCache->IsTypeFinal() || ctorCache->CtorHasNoExplicitReturnValue());

    if (ctorCache != nullptr && !ctorCache->SkipNewScObject() && (isCtorInlined || ctorCache->IsTypeFinal()))
    {
        GenerateBailAtOperation(instrPtr, IR::BailOutFailedCtorGuardCheck);
    }
}